

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cluster::DoWriteFrame(Cluster *this,Frame *frame)

{
  bool bVar1;
  uint64_t uVar2;
  mapped_type *pmVar3;
  uint64_t local_30;
  uint64 local_28;
  uint64_t element_size;
  Frame *frame_local;
  Cluster *this_local;
  
  if ((frame == (Frame *)0x0) ||
     (element_size = (uint64_t)frame, frame_local = (Frame *)this, bVar1 = Frame::IsValid(frame),
     !bVar1)) {
    return false;
  }
  bVar1 = PreWriteBlock(this);
  if (!bVar1) {
    return false;
  }
  local_28 = WriteFrame(this->writer_,(Frame *)element_size,this);
  if (local_28 == 0) {
    return false;
  }
  PostWriteBlock(this,local_28);
  uVar2 = Frame::timestamp((Frame *)element_size);
  local_30 = Frame::track_number((Frame *)element_size);
  pmVar3 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[](&this->last_block_timestamp_,&local_30);
  *pmVar3 = uVar2;
  return true;
}

Assistant:

bool Cluster::DoWriteFrame(const Frame* const frame) {
  if (!frame || !frame->IsValid())
    return false;

  if (!PreWriteBlock())
    return false;

  const uint64_t element_size = WriteFrame(writer_, frame, this);
  if (element_size == 0)
    return false;

  PostWriteBlock(element_size);
  last_block_timestamp_[frame->track_number()] = frame->timestamp();
  return true;
}